

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

archive_vtable_conflict * archive_read_vtable(void)

{
  if (archive_read_vtable::inited == 0) {
    archive_read_vtable::av.archive_filter_bytes = _archive_filter_bytes;
    archive_read_vtable::av.archive_filter_code = _archive_filter_code;
    archive_read_vtable::av.archive_filter_name = _archive_filter_name;
    archive_read_vtable::av.archive_filter_count = _archive_filter_count;
    archive_read_vtable::av.archive_read_data_block = _archive_read_data_block;
    archive_read_vtable::av.archive_read_next_header = _archive_read_next_header;
    archive_read_vtable::av.archive_read_next_header2 = _archive_read_next_header2;
    archive_read_vtable::av.archive_free = _archive_read_free;
    archive_read_vtable::av.archive_close = _archive_read_close;
    archive_read_vtable::inited = 1;
  }
  return &archive_read_vtable::av;
}

Assistant:

static struct archive_vtable *
archive_read_vtable(void)
{
	static struct archive_vtable av;
	static int inited = 0;

	if (!inited) {
		av.archive_filter_bytes = _archive_filter_bytes;
		av.archive_filter_code = _archive_filter_code;
		av.archive_filter_name = _archive_filter_name;
		av.archive_filter_count = _archive_filter_count;
		av.archive_read_data_block = _archive_read_data_block;
		av.archive_read_next_header = _archive_read_next_header;
		av.archive_read_next_header2 = _archive_read_next_header2;
		av.archive_free = _archive_read_free;
		av.archive_close = _archive_read_close;
		inited = 1;
	}
	return (&av);
}